

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpiabi_defn_functions_c.h
# Opt level: O0

int MPIABI_Graph_get(MPIABI_Comm comm,int maxindex,int maxedges,int *index,int *edges)

{
  int iVar1;
  ompi_communicator_t *poVar2;
  WPI_Handle<ompi_communicator_t_*> local_30;
  int *local_28;
  int *edges_local;
  int *index_local;
  int maxedges_local;
  int maxindex_local;
  MPIABI_Comm comm_local;
  
  local_28 = edges;
  edges_local = index;
  index_local._0_4_ = maxedges;
  index_local._4_4_ = maxindex;
  _maxedges_local = comm;
  WPI_Handle<ompi_communicator_t_*>::WPI_Handle(&local_30,comm);
  poVar2 = WPI_Handle::operator_cast_to_ompi_communicator_t_((WPI_Handle *)&local_30);
  iVar1 = MPI_Graph_get(poVar2,index_local._4_4_,(int)index_local,edges_local,local_28);
  return iVar1;
}

Assistant:

int MPIABI_Graph_get(
  MPIABI_Comm comm,
  int maxindex,
  int maxedges,
  int * index,
  int * edges
) {
  return MPI_Graph_get(
    (MPI_Comm)(WPI_Comm)comm,
    maxindex,
    maxedges,
    index,
    edges
  );
}